

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_ManDivNormalize(Vec_Int_t *vCubeFree)

{
  uint uVar1;
  uint uVar3;
  uint *in_RSI;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar2;
  
  if ((int)vCubeFree != 4) {
    __assert_fail("Vec_IntSize(vCubeFree) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x232,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  uVar1 = *in_RSI;
  if ((-1 < (int)uVar1) && (uVar4 = in_RSI[1], -1 < (int)uVar4)) {
    uVar5 = uVar1 & 1;
    uVar8 = uVar4 & 1;
    uVar7 = in_RSI[2];
    if ((uVar4 ^ uVar1) < 4 && uVar5 != uVar8) {
      if ((-1 < (int)uVar7) && (uVar6 = in_RSI[3], -1 < (int)uVar6)) {
        uVar11 = uVar7 & 1;
        uVar9 = uVar6 & 1;
        if (uVar11 == uVar9) {
          return -1;
        }
        uVar3 = uVar1;
        uVar2 = uVar4;
        if (uVar5 == uVar11) {
          uVar10 = uVar6;
          uVar6 = uVar7;
          if (uVar8 != uVar9) {
            __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                          ,0x23a,"int Fx_ManDivNormalize(Vec_Int_t *)");
          }
        }
        else {
          if (uVar5 != uVar9) {
            __assert_fail("Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                          ,0x23f,"int Fx_ManDivNormalize(Vec_Int_t *)");
          }
          uVar10 = uVar7;
          if (uVar8 != uVar11) {
            __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                          ,0x240,"int Fx_ManDivNormalize(Vec_Int_t *)");
          }
        }
        goto LAB_0025c685;
      }
    }
    else if (-1 < (int)uVar7) {
      uVar9 = uVar7 & 1;
      uVar6 = in_RSI[3];
      uVar10 = uVar1;
      if ((uVar7 ^ uVar4) < 4 && uVar8 != uVar9) {
        if ((int)uVar6 < 0) goto LAB_0025c6e8;
        if (uVar5 == (uVar6 & 1)) {
          return -1;
        }
        uVar3 = uVar4;
        uVar2 = uVar7;
        if (uVar5 == uVar8) {
          uVar10 = uVar6;
          uVar6 = uVar1;
        }
      }
      else {
        if ((int)uVar6 < 0) goto LAB_0025c6e8;
        if (uVar5 == uVar8) {
          return -1;
        }
        if (uVar9 == (uVar6 & 1)) {
          return -1;
        }
        if (3 < (uVar6 ^ uVar7)) {
          return -1;
        }
        uVar3 = uVar7;
        uVar2 = uVar6;
        uVar6 = uVar4;
        if (uVar9 == uVar5) {
          uVar10 = uVar4;
          uVar6 = uVar1;
        }
      }
LAB_0025c685:
      uVar1 = uVar2 >> 1;
      if ((uVar2 ^ uVar3) >> 1 != 1) {
        __assert_fail("LitA0 == Abc_LitNot(LitB0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0x25a,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
      uVar10 = uVar10 >> 1;
      uVar4 = uVar3 >> 1;
      uVar7 = uVar6 >> 1;
      if ((uVar3 & 2) == 0) {
        uVar4 = uVar1;
        uVar7 = uVar10;
        uVar1 = uVar3 >> 1;
        uVar10 = uVar6 >> 1;
      }
      if ((uVar1 & 1) == 0) {
        *in_RSI = uVar1 * 2;
        in_RSI[1] = uVar4 * 2 + 1;
        in_RSI[2] = uVar10 * 2 & 0xfffffffc;
        in_RSI[3] = (uVar7 ^ uVar10 & 1) * 2 + 1;
        return uVar10 & 1;
      }
      __assert_fail("!Abc_LitIsCompl(LitA0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0x260,"int Fx_ManDivNormalize(Vec_Int_t *)");
    }
  }
LAB_0025c6e8:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10d,"int Abc_LitIsCompl(int)");
}

Assistant:

static int Fx_ManDivNormalize( Vec_Int_t * vCubeFree ) // return 1 if complemented
{
    int * L = Vec_IntArray(vCubeFree);
    int RetValue = 0, LitA0 = -1, LitB0 = -1, LitA1 = -1, LitB1 = -1;
    assert( Vec_IntSize(vCubeFree) == 4 );
    if ( Abc_LitIsCompl(L[0]) != Abc_LitIsCompl(L[1]) && (L[0] >> 2) == (L[1] >> 2) ) // diff cubes, same vars
    {
        if ( Abc_LitIsCompl(L[2]) == Abc_LitIsCompl(L[3]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[0]), LitB0 = Abc_Lit2Var(L[1]);
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[2]) )
        {
            assert( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3]) );
            LitA1 = Abc_Lit2Var(L[2]), LitB1 = Abc_Lit2Var(L[3]);
        }
        else
        {
            assert( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3]) );
            assert( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2]) );
            LitA1 = Abc_Lit2Var(L[3]), LitB1 = Abc_Lit2Var(L[2]);
        }
    }
    else if ( Abc_LitIsCompl(L[1]) != Abc_LitIsCompl(L[2]) && (L[1] >> 2) == (L[2] >> 2) )
    {
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[1]), LitB0 = Abc_Lit2Var(L[2]);
        if ( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[0]) )
            LitA1 = Abc_Lit2Var(L[0]), LitB1 = Abc_Lit2Var(L[3]);
        else
            LitA1 = Abc_Lit2Var(L[3]), LitB1 = Abc_Lit2Var(L[0]);
    }
    else if ( Abc_LitIsCompl(L[2]) != Abc_LitIsCompl(L[3]) && (L[2] >> 2) == (L[3] >> 2) )
    {
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[1]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[2]), LitB0 = Abc_Lit2Var(L[3]);
        if ( Abc_LitIsCompl(L[2]) == Abc_LitIsCompl(L[0]) )
            LitA1 = Abc_Lit2Var(L[0]), LitB1 = Abc_Lit2Var(L[1]);
        else
            LitA1 = Abc_Lit2Var(L[1]), LitB1 = Abc_Lit2Var(L[0]);
    }
    else 
        return -1;
    assert( LitA0 == Abc_LitNot(LitB0) );
    if ( Abc_LitIsCompl(LitA0) )
    {
        ABC_SWAP( int, LitA0, LitB0 );
        ABC_SWAP( int, LitA1, LitB1 );
    }
    assert( !Abc_LitIsCompl(LitA0) );
    if ( Abc_LitIsCompl(LitA1) )
    {
        LitA1 = Abc_LitNot(LitA1);
        LitB1 = Abc_LitNot(LitB1);
        RetValue = 1;
    }
    assert( !Abc_LitIsCompl(LitA1) );
    // arrange literals in such as a way that
    // - the first two literals are control literals from different cubes
    // - the third literal is non-complented data input
    // - the forth literal is possibly complemented data input
    L[0] = Abc_Var2Lit( LitA0, 0 );
    L[1] = Abc_Var2Lit( LitB0, 1 );
    L[2] = Abc_Var2Lit( LitA1, 0 );
    L[3] = Abc_Var2Lit( LitB1, 1 );
    return RetValue;
}